

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_ctype_xdigit(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  byte bVar1;
  undefined8 in_RAX;
  byte *pbVar2;
  ushort **ppuVar3;
  jx9_value *pObj;
  byte *pbVar4;
  int nLen;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  if (0 < nArg) {
    pbVar2 = (byte *)jx9_value_to_string(*apArg,&local_24);
    if (0 < (long)local_24) {
      pbVar4 = pbVar2 + local_24;
      do {
        bVar1 = *pbVar2;
        if (0xbf < (ulong)bVar1) goto LAB_0013340b;
        ppuVar3 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar3 + (ulong)bVar1 * 2 + 1) & 0x10) == 0) goto LAB_0013340b;
        pbVar2 = pbVar2 + 1;
      } while (pbVar2 < pbVar4);
      pObj = pCtx->pRet;
      jx9MemObjRelease(pObj);
      (pObj->x).rVal = 4.94065645841247e-324;
      goto LAB_0013341e;
    }
  }
LAB_0013340b:
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
LAB_0013341e:
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_ctype_xdigit(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const unsigned char *zIn, *zEnd;
	int nLen;
	if( nArg < 1 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn  = (const unsigned char *)jx9_value_to_string(apArg[0], &nLen);
	zEnd = &zIn[nLen];
	if( nLen < 1 ){
		/* Empty string, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	for(;;){
		if( zIn >= zEnd ){
			/* If we reach the end of the string, then the test succeeded. */
			jx9_result_bool(pCtx, 1);
			return JX9_OK;
		}
		if( zIn[0] >= 0xc0 ){
			/* UTF-8 stream  */
			break;
		}
		if( !SyisHex(zIn[0]) ){
			break;
		}
		/* Point to the next character */
		zIn++;
	}
	/* The test failed, return FALSE */
	jx9_result_bool(pCtx, 0);
	return JX9_OK;
}